

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

Inst * __thiscall mir::inst::PtrOffsetInst::deep_copy(PtrOffsetInst *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Inst *pIVar3;
  anon_class_8_1_a78179b7_conflict local_58;
  undefined **local_50;
  Inst local_48;
  
  pIVar3 = (Inst *)operator_new(0x48);
  uVar1 = (this->super_Inst).dest.id;
  uVar2 = (this->ptr).id;
  local_48.dest.id._0_1_ = (this->offset).field_0x18;
  local_58.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_48;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)(char)local_48.dest.id + 1]._M_data)
            (&local_58,(variant<int,_mir::inst::VarId> *)&(this->offset).field_0x8);
  local_50 = &PTR_display_001ecf98;
  local_48.dest.id._1_1_ = (this->offset).shift;
  local_48.dest.id._2_1_ = (this->offset).shift_amount;
  (pIVar3->dest).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  (pIVar3->dest).id = uVar1;
  (pIVar3->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed348;
  pIVar3[1].super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  *(uint32_t *)&pIVar3[1].dest.super_Displayable._vptr_Displayable = uVar2;
  local_58.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)(pIVar3 + 2);
  *(char *)&pIVar3[2].dest.id = (char)local_48.dest.id;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)(char)local_48.dest.id + 1]._M_data)
            (&local_58,(variant<int,_mir::inst::VarId> *)&local_48);
  *(undefined ***)&pIVar3[1].dest.id = &PTR_display_001ecf98;
  *(undefined2 *)((long)&pIVar3[2].dest.id + 1) = local_48.dest.id._1_2_;
  return pIVar3;
}

Assistant:

Inst* deep_copy() { return new PtrOffsetInst(dest, ptr, offset); }